

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O2

void __thiscall ins_ekf::InsEkf::Update(InsEkf *this)

{
  Matrix<double,_11,_1,_0,_11,_1> *this_00;
  Vector3d *v;
  Matrix<double,_15,_15,_0,_15,_15> *dst;
  RealScalar RVar1;
  double dVar2;
  ReturnType RVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Vector3d gps_velocity_I;
  Vector3d gps_offset_I;
  Vector4d q_BtoI;
  double local_1140;
  Vector3d d_gps_roI_d_yaw;
  Vector3d d_gps_roI_d_pitch;
  Vector3d d_gps_roI_d_roll;
  Vector3d d_gps_roI_d_biasGq;
  Vector3d d_gps_roI_d_biasGp;
  Matrix<double,_5,_1,_0,_5,_1> h;
  Matrix<double,_15,_15,_0,_15,_15> *local_1098;
  Matrix<double,_15,_15,_0,_15,_15> *local_1090;
  Vector3d d_gps_roI_d_biasGr;
  Vector3d gps_rot_offset_I;
  Matrix3d I_3;
  Matrix<double,_5,_5,_0,_5,_5> Q_gps_diag;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>,_0>_>
  local_f40;
  Matrix3d R_yaw;
  Vector3d gps_rot_offset;
  Vector3d pqr_est;
  Matrix<double,_5,_5,_0,_5,_5> S;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_dc8 [16];
  double local_db8;
  undefined8 uStack_db0;
  Matrix3d R_pitch;
  Matrix<double,_5,_1,_0,_5,_1> residual;
  Matrix<double,_15,_5,_0,_15,_5> K;
  Matrix<double,_15,_15,_0,_15,_15> I_KH;
  Matrix<double,_15,_1,_0,_15,_1> dx;
  Matrix<double,_5,_15,_0,_5,_15> H;
  Matrix<double,_5,_5,_0,_5,_5> S_inverse;
  
  this_00 = &this->last_measurements_;
  bVar6 = Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::hasNaN
                    ((DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)this_00);
  if (!bVar6) {
    Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,1,0,5,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>> *)&h,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                *)&I_KH);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&q_BtoI;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = 0.0;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = 4.94065645841247e-324;
    q_BtoI.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         -(this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0];
    H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.array[0] =
         -(this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&I_KH,
                        (Scalar *)&H);
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[0] =
         -(this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2];
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar7,(Scalar *)&K);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
              (pCVar7,(this->orientation_).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&I_KH);
    v = &this->gps_offset_;
    RotateVectByQuat(&gps_offset_I,&q_BtoI,v);
    H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.array[0] =
         (double)&this->position_;
    H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.array[1] =
         (double)&gps_offset_I;
    Eigen::Block<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_5,_1,_0,_5,_1>,__1,__1,_false> *)&I_KH,&h,0,0,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,5,1,0,5,1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Block<Eigen::Matrix<double,_5,_1,_0,_5,_1>,__1,__1,_false> *)&I_KH,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&H);
    Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)&H,this_00,0,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&I_KH,(MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)&H
               ,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_g_);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pqr_est,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&I_KH);
    SkewSymmetric((Matrix3d *)&I_KH,&pqr_est);
    H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.array[1] =
         (double)v;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&gps_rot_offset,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&H);
    RotateVectByQuat(&gps_rot_offset_I,&q_BtoI,&gps_rot_offset);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&this->velocity_;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = (double)&gps_rot_offset_I;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&gps_velocity_I,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&I_KH);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,
               (Matrix<double,_3,_1,_0,_3,_1> *)&gps_velocity_I,0,2);
    RVar1 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
            norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)
                 &I_KH);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)&h,3,0);
    *pSVar8 = RVar1;
    dVar2 = atan2(gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1],
                  gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0]);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)&h,4,0);
    *pSVar8 = dVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,5,15,0,5,15>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,15,0,5,15>>>
              ((PlainObjectBase<Eigen::Matrix<double,5,15,0,5,15>> *)&H,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>_>_>
                *)&I_KH);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&I_KH,&H,0,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&I_KH,
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                *)&K);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0
    ;
    I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0
    ;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = 0.0;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = 0.0;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = -(this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[2];
    RPYToRotMat(&R_yaw,(Vector3d *)&I_KH);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = 0.0;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = -(this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = 0.0;
    RPYToRotMat(&R_pitch,(Vector3d *)&I_KH);
    SkewSymmetric((Matrix3d *)&K,&gps_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)&S,
                    &I_3,0);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[5]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[6]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[2];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[7]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[3];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[4];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[9]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[5];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&K;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&R_yaw;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = (double)&R_pitch;
    Eigen::Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,&H,0,0,3,
               1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,
               (Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
                *)&I_KH);
    SkewSymmetric((Matrix3d *)&K,&gps_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)&S,
                    &I_3,1);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&R_yaw;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[5]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[2];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[6]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[3];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[7]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[4];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[5];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&K;
    Eigen::Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,&H,0,1,3,
               1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,
               (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
                *)&I_KH);
    SkewSymmetric((Matrix3d *)&I_KH,&gps_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)&S,
                    &I_3,2);
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[2] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[3] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[4] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[2];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[5] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[3];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[6] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[4];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[7] =
         S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[5];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    Eigen::Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,&H,0,2,3,
               1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((Block<Eigen::Matrix<double,_5,_15,_0,_5,_15>,__1,__1,_false> *)&Q_gps_diag,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
                *)&K);
    dVar2 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] / RVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,6);
    *pSVar9 = dVar2;
    dVar2 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1] / RVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,7);
    *pSVar9 = dVar2;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [0] = -1.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [1] = 0.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [2] = 0.0;
    SkewSymmetric((Matrix3d *)&I_KH,(Vector3d *)&Q_gps_diag);
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1] =
         (double)v;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&K,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&S);
    RotateVectByQuat(&d_gps_roI_d_biasGp,&q_BtoI,(Vector3d *)&K);
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [0] = 0.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [1] = -1.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [2] = 0.0;
    SkewSymmetric((Matrix3d *)&I_KH,(Vector3d *)&Q_gps_diag);
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1] =
         (double)v;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&K,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&S);
    RotateVectByQuat(&d_gps_roI_d_biasGq,&q_BtoI,(Vector3d *)&K);
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [0] = 0.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [1] = 0.0;
    Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [2] = -1.0;
    SkewSymmetric((Matrix3d *)&I_KH,(Vector3d *)&Q_gps_diag);
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1] =
         (double)v;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&K,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&S);
    RotateVectByQuat(&d_gps_roI_d_biasGr,&q_BtoI,(Vector3d *)&K);
    SkewSymmetric((Matrix3d *)&K,&gps_rot_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    &Q_gps_diag,&I_3,0);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = (double)&R_pitch;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[0];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[5]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[6]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[2];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[7]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[3];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[4];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[9]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[5];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&K;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&R_yaw;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_gps_roI_d_roll,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&I_KH);
    SkewSymmetric((Matrix3d *)&K,&gps_rot_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    &Q_gps_diag,&I_3,1);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[0];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[5]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[2];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[6]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[3];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[7]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[4];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array[5];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&K;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&R_yaw;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_gps_roI_d_pitch,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&I_KH);
    SkewSymmetric((Matrix3d *)&I_KH,&gps_rot_offset_I);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    &Q_gps_diag,&I_3,2);
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[2] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[0];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[3] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[1];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[4] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[2];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[5] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[3];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[6] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[4];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[7] =
         Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[5];
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[0] =
         (double)&I_KH;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_gps_roI_d_yaw,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&K);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_roll,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,0);
    *pSVar9 = RVar3 / RVar1;
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_pitch,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,1);
    *pSVar9 = RVar3 / RVar1;
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_yaw,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,2);
    *pSVar9 = RVar3 / RVar1;
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_biasGp,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,9);
    *pSVar9 = RVar3 / RVar1;
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_biasGq,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,10);
    *pSVar9 = RVar3 / RVar1;
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&I_KH,&gps_velocity_I,0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1> *)&K,&d_gps_roI_d_biasGr,0,2);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> *)&I_KH
                       ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                         *)&K);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,3,0xb);
    *pSVar9 = RVar3 / RVar1;
    dVar4 = (double)((ulong)gps_velocity_I.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[1] ^ (ulong)DAT_0011b840);
    dVar2 = RVar1 * RVar1;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,6);
    *pSVar9 = dVar4 / dVar2;
    dVar4 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] / dVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,7);
    *pSVar9 = dVar4;
    dVar4 = d_gps_roI_d_roll.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            d_gps_roI_d_roll.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,0);
    *pSVar9 = (dVar5 - dVar4) / dVar2;
    dVar4 = d_gps_roI_d_pitch.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[0] *
            gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            d_gps_roI_d_pitch.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,1);
    *pSVar9 = (dVar5 - dVar4) / dVar2;
    dVar4 = d_gps_roI_d_yaw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            d_gps_roI_d_yaw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,2);
    *pSVar9 = (dVar5 - dVar4) / dVar2;
    dVar4 = d_gps_roI_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] *
            gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            d_gps_roI_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,9);
    *pSVar9 = (dVar5 - dVar4) / dVar2;
    dVar4 = d_gps_roI_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] *
            gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] *
            d_gps_roI_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,10);
    *pSVar9 = (dVar5 - dVar4) / dVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)&H,4,0xb);
    *pSVar9 = (gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
               .m_data.array[0] *
               d_gps_roI_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1] -
              d_gps_roI_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] *
              gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1]) / dVar2;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&this->Q_gps_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,5,5,0,5,5>,Eigen::DiagonalWrapper<Eigen::Matrix<double,5,1,0,5,1>const>>
              (&Q_gps_diag,(DiagonalWrapper<const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&I_KH);
    dst = &this->P_;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&H;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = (double)dst;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&H;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = (double)&Q_gps_diag;
    Eigen::PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>const,Eigen::Matrix<double,5,5,0,5,5>const>>
              ((PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>> *)&S,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
                *)&I_KH);
    Eigen::MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,5,5,0,5,5>>>
              ((PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>> *)&S_inverse,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
                *)&I_KH);
    Eigen::LLT<Eigen::Matrix<double,5,5,0,5,5>,2>::LLT<Eigen::Matrix<double,5,5,0,5,5>>
              ((LLT<Eigen::Matrix<double,5,5,0,5,5>,2> *)&I_KH,
               (EigenBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&S);
    Eigen::LLT<Eigen::Matrix<double,5,5,0,5,5>,2>::solveInPlace<Eigen::Matrix<double,5,5,0,5,5>>
              ((LLT<Eigen::Matrix<double,5,5,0,5,5>,2> *)&I_KH,
               (MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&S_inverse);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)dst;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = (double)&H;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2]
         = (double)&S_inverse;
    Eigen::PlainObjectBase<Eigen::Matrix<double,15,5,0,15,5>>::
    _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>,Eigen::Matrix<double,5,5,0,5,5>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,15,5,0,15,5>> *)&K,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>_>
                *)&I_KH);
    Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)&dx,this_00,6,5);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>
                *)&I_KH,(MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)
                        &dx,(MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&h);
    Eigen::PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,5,1,0,5,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>> *)&residual,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                *)&I_KH);
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = (double)&K;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1]
         = (double)&residual;
    Eigen::PlainObjectBase<Eigen::Matrix<double,15,1,0,15,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,1,0,5,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,15,1,0,15,1>> *)&dx,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>_>
                *)&I_KH);
    local_db8 = dx.super_PlainObjectBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>_>.m_storage.m_data.
                array[2] * 0.5;
    dVar2 = dx.super_PlainObjectBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>_>.m_storage.m_data.array
            [0] * 0.5;
    dVar4 = dx.super_PlainObjectBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>_>.m_storage.m_data.array
            [1] * 0.5;
    local_dc8._8_4_ = SUB84(dVar4,0);
    local_dc8._0_8_ = dVar2;
    local_dc8._12_4_ = (int)((ulong)dVar4 >> 0x20);
    uStack_db0 = 0x3ff0000000000000;
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = SQRT(dVar4 * dVar4 + 1.0 + local_db8 * local_db8 + dVar2 * dVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=(local_dc8,(Scalar *)&I_KH);
    QuatMultiply((Vector4d *)local_dc8,&this->orientation_);
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] =
         I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
         array[2];
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] =
         I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
         array[3];
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] =
         I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
         array[0];
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] =
         I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
         array[1];
    I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0]
         = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this,(Scalar *)&I_KH);
    Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false> *)&I_KH,&dx,3,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->position_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &I_KH);
    Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false> *)&I_KH,&dx,6,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->velocity_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &I_KH);
    Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false> *)&I_KH,&dx,9,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->bias_g_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &I_KH);
    Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false> *)&I_KH,&dx,0xc,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->bias_a_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &I_KH);
    Eigen::MatrixBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::Identity();
    local_f40.m_lhs.m_rhs.m_matrix = (non_const_type)&H;
    local_f40.m_lhs.m_lhs.m_rhs = (RhsNested)&K;
    Eigen::PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,15,15,0,15,15>>const,Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,15,0,5,15>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>> *)&I_KH,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>,_0>_>_>
                *)&local_f40);
    local_f40.m_rhs.m_lhs.m_rhs = &Q_gps_diag;
    local_f40.m_lhs.m_lhs.m_lhs = (LhsNested)&I_KH;
    local_f40.m_lhs.m_lhs.m_rhs = dst;
    local_f40.m_lhs.m_rhs.m_matrix = (non_const_type)&I_KH;
    local_f40.m_rhs.m_lhs.m_lhs = (LhsNested)&K;
    local_f40.m_rhs.m_rhs.m_matrix = (non_const_type)&K;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,5,0,5,5>,0>,Eigen::Transpose<Eigen::Matrix<double,15,5,0,15,5>>,0>const>>
              (dst,&local_f40);
    local_1140 = 0.5;
    local_1098 = dst;
    local_1090 = dst;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>
                      *)&local_f40,&local_1140,(StorageBaseType *)&local_1098);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,15,15,0,15,15>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,15,15,0,15,15>const,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>const>const>>
              (dst,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>
                    *)&local_f40);
  }
  return;
}

Assistant:

void InsEkf::Update() {

        if(!last_measurements_.hasNaN()){ // need GPS measurements to update

            // measurement model
            std::size_t gps_start = m_I(MI::gpsX);
            Eigen::Matrix<double, 5, 1> h = Eigen::Matrix<double, 5, 1>::Zero();

            Eigen::Vector4d q_BtoI;
            // quaternion of the vehicle's orientation estimate
            q_BtoI << -orientation_[0], -orientation_[1], -orientation_[2], orientation_[3];
            // GPS antenna offset from vehicle center rotated to inertial frame
            Eigen::Vector3d gps_offset_I = RotateVectByQuat(q_BtoI, gps_offset_);
            // expected GPS position measurement based on vehicle position
            h.block(m_I(MI::gpsX) - gps_start, 0, 3, 1) = position_ + gps_offset_I;

            Eigen::Vector3d pqr_est = last_measurements_.segment(m_I(MI::p), 3) - bias_g_;
            // motion of GPS antenna due to rotation at an offset about vehicle center, in body frame
            Eigen::Vector3d gps_rot_offset = SkewSymmetric(pqr_est) * gps_offset_;
            // transform to inertial frame
            Eigen::Vector3d gps_rot_offset_I = RotateVectByQuat(q_BtoI, gps_rot_offset);
            // velocity of GPS antenna in inertial frame
            Eigen::Vector3d gps_velocity_I = velocity_ + gps_rot_offset_I;

            // GPS velocity in inertial XY plane
            double Vxy_norm = gps_velocity_I.segment(0, 2).norm();
            // expeted GPS velocity measurement
            h(m_I(MI::gpsV) - gps_start, 0) = Vxy_norm;
            // expected GPS heading measurement
            h(m_I(MI::gpsPsi) - gps_start, 0) = atan2(gps_velocity_I[1], gps_velocity_I[0]); // atan2(Vy, Vx)

            // measurement model jacobian
            Eigen::Matrix<double, 5, s_I(SI::NUM_STATES)> H = Eigen::Matrix<double, 5, s_I(SI::NUM_STATES)>::Zero();
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::x), 3, 3) = Eigen::Matrix3d::Identity();

            Eigen::Matrix3d I_3 = Eigen::Matrix3d::Identity();
            // derivative of orientation rotation matrix wrt yaw angle
            Eigen::Matrix3d R_yaw = RPYToRotMat(Eigen::Vector3d{0.0, 0.0, -orientation_[2]});
            // derivative of orientation rotation matrix wrt pitch angle
            Eigen::Matrix3d R_pitch = RPYToRotMat(Eigen::Vector3d{0.0, -orientation_[1], 0.0});
            // derivatives of expected GPS position measurements wrt angle state estimates
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::roll), 3, 1) = -SkewSymmetric(gps_offset_I) * R_yaw * R_pitch * I_3.col(0); // d gps_offset_I / d roll
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::pitch), 3, 1) = -SkewSymmetric(gps_offset_I) * R_yaw * I_3.col(1); // d gps_offset_I / d pitch
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::yaw), 3, 1) = -SkewSymmetric(gps_offset_I) * I_3.col(2); // d gps_offset_I / d yaw

            // derivative of expected GPS velocity measurement wrt velocity state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::Vx)) = gps_velocity_I[0] / Vxy_norm; // Vx / norm(Vxy)
            H(m_I(MI::gpsV) - gps_start, s_I(SI::Vy)) = gps_velocity_I[1] / Vxy_norm; // Vy / norm(Vxy)

            // derivatives of of GPS antenna rotational motion wrt gyro bias state estimates
            Eigen::Vector3d d_gps_roI_d_biasGp = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{-1.0, 0.0, 0.0})*gps_offset_);
            Eigen::Vector3d d_gps_roI_d_biasGq = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{0.0, -1.0, 0.0})*gps_offset_);
            Eigen::Vector3d d_gps_roI_d_biasGr = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{0.0, 0.0, -1.0})*gps_offset_);

            // derivatives of GPS antenna rotational motion wrt angle state estimates
            Eigen::Vector3d d_gps_roI_d_roll = -SkewSymmetric(gps_rot_offset_I) * R_yaw * R_pitch * I_3.col(0); // d gps_rot_offset_I / d roll
            Eigen::Vector3d d_gps_roI_d_pitch = -SkewSymmetric(gps_rot_offset_I) * R_yaw * I_3.col(1); // d gps_rot_offset_I / d pitch
            Eigen::Vector3d d_gps_roI_d_yaw = -SkewSymmetric(gps_rot_offset_I) * I_3.col(2); // d gps_rot_offset_I / d yaw

            // derivative of expected GPS velocity measurement wrt angle state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::roll)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_roll.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::pitch)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_pitch.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::yaw)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_yaw.segment(0, 2)) / Vxy_norm;

            // derivative of expected GPS velocity measurement wrt gyro bias state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGp)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGp.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGq)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGq.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGr)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGr.segment(0, 2)) / Vxy_norm;

            // derivative of expected GPS heading measurement wrt velocity state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::Vx)) = -gps_velocity_I[1] / pow(Vxy_norm, 2); // -Vy / norm(Vxy)^2
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::Vy)) = gps_velocity_I[0] / pow(Vxy_norm, 2); // Vx / norm(Vxy)^2

            // derivative of expected GPS heading measurement wrt angle state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::roll)) = (gps_velocity_I[0] * d_gps_roI_d_roll[1] - gps_velocity_I[1] * d_gps_roI_d_roll[0]) / pow(Vxy_norm, 2); // (Vx*dVy/droll - Vy*dVx/droll) / norm^2
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::pitch)) = (gps_velocity_I[0] * d_gps_roI_d_pitch[1] - gps_velocity_I[1] * d_gps_roI_d_pitch[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::yaw)) = (gps_velocity_I[0] * d_gps_roI_d_yaw[1] - gps_velocity_I[1] * d_gps_roI_d_yaw[0]) / pow(Vxy_norm, 2);

            // derivative of expected GPS heading measurement wrt gyro bias state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGp)) = (gps_velocity_I[0] * d_gps_roI_d_biasGp[1] - gps_velocity_I[1] * d_gps_roI_d_biasGp[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGq)) = (gps_velocity_I[0] * d_gps_roI_d_biasGq[1] - gps_velocity_I[1] * d_gps_roI_d_biasGq[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGr)) = (gps_velocity_I[0] * d_gps_roI_d_biasGr[1] - gps_velocity_I[1] * d_gps_roI_d_biasGr[0]) / pow(Vxy_norm, 2);

            // EKF update
            const Eigen::Matrix<double, 5, 5> Q_gps_diag = Q_gps_.asDiagonal();
            // covariance of residual
            Eigen::Matrix<double, 5, 5> S = H * P_ * H.transpose() + Q_gps_diag;

            Eigen::Matrix<double, 5, 5> S_inverse = Eigen::Matrix<double, 5, 5>::Identity();
            S.selfadjointView<Eigen::Upper>().llt().solveInPlace(S_inverse);
            // Kalman gain = P * H'/ S
            Eigen::Matrix<double, s_I(SI::NUM_STATES), 5> K = P_ * H.transpose() * S_inverse;

            Eigen::Matrix<double, 5, 1> residual = last_measurements_.segment(m_I(MI::gpsX), 5) - h;

            // update the states
            Eigen::Matrix<double, s_I(SI::NUM_STATES), 1> dx = K * residual;
            Eigen::Vector4d dq {0.5 * dx[s_I(SI::roll)], 0.5 * dx[s_I(SI::pitch)], 0.5 * dx[s_I(SI::yaw)], 1.0}; // small angle approximation
            dq /= dq.norm();
            orientation_ = QuatMultiply(dq, orientation_);
            orientation_ /= orientation_.norm();
            position_ += dx.block(s_I(SI::x), 0, 3, 1);
            velocity_ += dx.block(s_I(SI::Vx), 0, 3, 1);
            bias_g_ += dx.block(s_I(SI::biasGp), 0, 3, 1);
            bias_a_ += dx.block(s_I(SI::biasAx), 0, 3, 1);

            // update the covariance
            Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)> I_KH =
                    Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)>::Identity() - K * H;

            P_ = I_KH * P_ * I_KH.transpose() + K * Q_gps_diag * K.transpose();
            P_ = 0.5 * (P_ + P_.transpose());
            //P_ -= K * H * P_;

        }
    }